

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O0

double testKalmanFilterZeroInput(void)

{
  Scalar SVar1;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar2;
  ulong uVar3;
  long lVar4;
  Scalar *pSVar5;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  Scalar *pSVar6;
  result_type rVar7;
  RealScalar RVar8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar9
  ;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar10;
  Index *local_ae30;
  Index *local_ae18;
  Index *local_acd8;
  Index *local_acb8;
  Matrix<double,__1,_1,_0,__1,_1> local_ac40;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_ac30;
  undefined1 local_ac18 [8];
  StateVector error;
  Index i;
  non_const_type local_abe8;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_abe0;
  uint local_abcc;
  undefined1 local_abc8 [4];
  uint i_3;
  Pmatrix p;
  StateVector xh;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_ab90;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_ab70;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_ab60;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_ab40;
  double local_ab30;
  double local_ab28;
  undefined1 local_ab20 [8];
  normal_distribution<double> g_1;
  undefined1 local_ab08 [4];
  uint i_2;
  MeasureVector w;
  double local_aae8;
  double local_aae0;
  undefined1 local_aad8 [8];
  normal_distribution<double> g;
  undefined1 local_aac0 [4];
  uint i_1;
  StateVector v;
  Index k;
  InputVector u;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_aa90;
  undefined1 local_aa80 [8];
  Qmatrix q;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_aa60;
  undefined1 local_aa50 [8];
  Rmatrix r;
  Matrix<double,__1,__1,_0,__1,__1> local_aa30;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_aa18;
  undefined1 local_a9f0 [8];
  Qmatrix q1;
  Matrix<double,__1,__1,_0,__1,__1> local_a9d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_a9b8;
  undefined1 local_a990 [8];
  Rmatrix r1;
  lagged_fibonacci1279 gen_;
  StateVector x;
  MeasureVector yk [1000];
  StateVector xk [1001];
  Index kmax;
  Dmatrix d;
  Cmatrix c;
  Bmatrix b;
  Scalar local_400;
  Scalar local_3f8;
  Scalar local_3f0;
  Scalar local_3e8;
  Scalar local_3e0;
  Scalar local_3d8;
  Scalar local_3d0;
  Scalar local_3c8;
  Scalar local_3c0;
  Scalar local_3b8;
  Scalar local_3b0;
  Scalar local_3a8;
  Scalar local_3a0;
  Scalar local_398;
  Scalar local_390;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_388;
  undefined1 local_358 [8];
  Matrix<double,_4,_4,_0,_4,_4> a;
  filter f;
  
  stateObservation::LinearKalmanFilter::LinearKalmanFilter
            ((LinearKalmanFilter *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),4,3,0);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_358);
  local_390 = -0.6785714;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator<<
            (&local_388,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_358,&local_390);
  local_398 = 0.1156463;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (&local_388,&local_398);
  local_3a0 = 0.4392517;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3a0);
  local_3a8 = 0.2863946;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3a8);
  local_3b0 = 0.0865306;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3b0);
  local_3b8 = -0.027381;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3b8);
  local_3c0 = 0.3355102;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3c0);
  local_3c8 = 0.018415;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3c8);
  local_3d0 = -0.4172789;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3d0);
  local_3d8 = -0.2036735;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3d8);
  local_3e0 = -0.4434014;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3e0);
  local_3e8 = -0.2666667;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3e8);
  local_3f0 = 0.420068;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3f0);
  local_3f8 = 0.5387075;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_3f8);
  local_400 = 0.4883673;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar2,&local_400);
  b.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       -0x401cd7f3061c79b3;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
            (pCVar2,(Scalar *)
                    &b.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_388);
  stateObservation::LinearKalmanFilter::getBmatrixRandom();
  stateObservation::KalmanFilterBase::getCmatrixRandom();
  stateObservation::LinearKalmanFilter::getDmatrixRandom();
  xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1000;
  local_acb8 = &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_acb8);
    local_acb8 = local_acb8 + 2;
  } while (local_acb8 !=
           &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          );
  local_acd8 = &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_acd8);
    local_acd8 = local_acd8 + 2;
  } while (local_acd8 !=
           &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  stateObservation::ObserverBase::stateVectorZero();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)(gen_.x + 0x4fe));
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::lagged_fibonacci_01_engine
            ((lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
             &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_a9b8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a9d0,
             (double *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a990,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_a9b8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_a9d0);
  stateObservation::KalmanFilterBase::getQmatrixRandom();
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_aa18,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_aa30,
             (double *)
             &r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_a9f0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_aa18);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_aa30);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a990);
  local_aa60 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a990,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_aa50,&local_aa60);
  u.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a9f0);
  local_aa90 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a9f0,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&u.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_aa80,&local_aa90);
  stateObservation::ObserverBase::inputVectorZero();
  for (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
      v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0x3e9;
      v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 1) {
    stateObservation::ObserverBase::stateVectorZero();
    g._sigma._4_4_ = 0;
    while( true ) {
      uVar3 = (ulong)g._sigma._4_4_;
      lVar4 = stateObservation::ObserverBase::getStateSize();
      if (lVar4 <= (long)uVar3) break;
      local_aae0 = 0.0;
      local_aae8 = 1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)local_aad8,&local_aae0,&local_aae8);
      rVar7 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)local_aad8,
                         (lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
                         &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_aac0,
                          (ulong)g._sigma._4_4_);
      *pSVar5 = rVar7;
      g._sigma._4_4_ = g._sigma._4_4_ + 1;
    }
    PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a9f0,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_aac0);
    w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)PVar9.m_lhs;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_aac0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              );
    stateObservation::ObserverBase::measureVectorZero();
    g_1._sigma._4_4_ = 0;
    while( true ) {
      uVar3 = (ulong)g_1._sigma._4_4_;
      lVar4 = stateObservation::ObserverBase::getMeasureSize();
      if (lVar4 <= (long)uVar3) break;
      local_ab28 = 0.0;
      local_ab30 = 1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)local_ab20,&local_ab28,&local_ab30);
      rVar7 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)local_ab20,
                         (lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
                         &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_ab08,
                          (ulong)g_1._sigma._4_4_);
      *pSVar5 = rVar7;
      g_1._sigma._4_4_ = g_1._sigma._4_4_ + 1;
    }
    PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a990,
                       (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ab08);
    local_ab40 = PVar9;
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_ab08,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_ab40);
    PVar10 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_358,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(gen_.x + 0x4fe));
    local_ab70 = PVar10;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
    ::operator+(&local_ab60,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                 *)&local_ab70,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_aac0);
    other = Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                      ((Matrix<double,_1,1,0,_1,1> *)(gen_.x + 0x4fe),
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_ab60);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &yk[v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   + 999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,other);
    PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                       &d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_cols,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                (gen_.x + 0x4fe));
    xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)PVar9.m_lhs;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
    ::operator+(&local_ab90,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                 *)&xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ab08);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)
               (gen_.x + v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows * 2 + 0x4fe),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_ab90);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_ab08);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_aac0);
  }
  stateObservation::ObserverBase::stateVectorRandom();
  stateObservation::ZeroDelayObserver::setState
            ((Matrix *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(long)&p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols);
  stateObservation::KalmanFilterBase::getPmatrixZero();
  local_abcc = 0;
  while( true ) {
    uVar3 = (ulong)local_abcc;
    lVar4 = stateObservation::ObserverBase::getStateSize();
    if (lVar4 <= (long)uVar3) break;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols,(ulong)local_abcc);
    SVar1 = *pSVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_abc8,
                        (ulong)local_abcc,(ulong)local_abcc);
    *pSVar6 = SVar1;
    local_abcc = local_abcc + 1;
  }
  local_abe8 = (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_abc8);
  local_abe0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_abc8,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&local_abe8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_abc8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_abe0);
  stateObservation::KalmanFilterBase::setStateCovariance
            ((Matrix *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,4,4,0,4,4>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&i,
             (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_358);
  stateObservation::KalmanFilterBase::setA
            ((Matrix *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&i);
  stateObservation::LinearKalmanFilter::setB
            ((Matrix *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  stateObservation::KalmanFilterBase::setC
            ((Matrix *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  stateObservation::LinearKalmanFilter::setD
            ((Matrix *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  stateObservation::KalmanFilterBase::setR
            ((Matrix *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  stateObservation::KalmanFilterBase::setQ
            ((Matrix *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  for (error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
      error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0x3e9;
      error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 1
      ) {
    stateObservation::ZeroDelayObserver::setMeasurement
              ((Matrix *)
               (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),
               (long)(gen_.x + error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows * 2 + 0x4fe));
  }
  stateObservation::ZeroDelayObserver::getEstimatedState((long)&local_ac40);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_ac30,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_ac40,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &xk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_ac18,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_ac30);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_ac40);
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ac18);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_ac18);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_abc8)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&k);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_aa80)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_aa50)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a9f0)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_a990)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)(gen_.x + 0x4fe));
  local_ae18 = &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_ae18 = local_ae18 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_ae18);
  } while (local_ae18 !=
           &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  local_ae30 = &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_ae30 = local_ae30 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_ae30);
  } while (local_ae30 !=
           &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&kmax);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &d.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  stateObservation::LinearKalmanFilter::~LinearKalmanFilter
            ((LinearKalmanFilter *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  return RVar8;
}

Assistant:

double testKalmanFilterZeroInput()
{
  typedef stateObservation::LinearKalmanFilter filter;

  filter f(4, 3);
  Eigen::Matrix<double, 4, 4> a;

  a << -0.6785714, 0.1156463, 0.4392517, 0.2863946, 0.0865306, -0.0273810, 0.3355102, 0.0184150, -0.4172789, -0.2036735,
      -0.4434014, -0.2666667, 0.4200680, 0.5387075, 0.4883673, -0.598639;

  filter::Bmatrix b = f.getBmatrixRandom();
  filter::Cmatrix c = f.getCmatrixRandom();
  filter::Dmatrix d = f.getDmatrixRandom();

  const stateObservation::Index kmax = 1000;

  filter::StateVector xk[kmax + 1];
  filter::MeasureVector yk[kmax];

  filter::StateVector x = f.stateVectorZero();

  xk[0] = x;

  boost::lagged_fibonacci1279 gen_;

  filter::Rmatrix r1 = f.getRmatrixRandom() * 0.01;

  filter::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  filter::Rmatrix r(r1 * r1.transpose());
  filter::Qmatrix q(q1 * q1.transpose());

  filter::InputVector u = f.inputVectorZero();

  for(stateObservation::Index k = 1; k <= kmax; ++k)
  {

    filter::StateVector v = f.stateVectorZero();
    for(unsigned i = 0; i < f.getStateSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      v[i] = g(gen_);
    }
    v = q1 * v;

    filter::MeasureVector w = f.measureVectorZero();
    for(unsigned i = 0; i < f.getMeasureSize(); ++i)
    {
      boost::normal_distribution<> g(0, 1);
      w[i] = g(gen_);
    }
    w = r1 * w;

    xk[k] = x = a * x + v;
    yk[k - 1] = c * x + w;
  }

  filter::StateVector xh = f.stateVectorRandom();

  f.setState(xh, 0);

  filter::Pmatrix p = f.getPmatrixZero();

  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();

  f.setStateCovariance(p);

  f.setA(a);
  f.setB(b);
  f.setC(c);
  f.setD(d);

  f.setR(r);
  f.setQ(q);

  stateObservation::Index i;

  for(i = 1; i <= kmax; ++i)
  {
    f.setMeasurement(yk[i - 1], i);
  }

  filter::StateVector error = f.getEstimatedState(kmax) - xk[kmax];

  return error.norm();
}